

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlRule.h
# Opt level: O1

void __thiscall GdlSubstitutionItem::~GdlSubstitutionItem(GdlSubstitutionItem *this)

{
  pointer piVar1;
  pointer ppGVar2;
  ulong uVar3;
  
  (this->super_GdlSetAttrItem).super_GdlRuleItem._vptr_GdlRuleItem =
       (_func_int **)&PTR_Clone_00242ab0;
  ppGVar2 = (this->m_vpexpAssocs).
            super__Vector_base<GdlSlotRefExpression_*,_std::allocator<GdlSlotRefExpression_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_vpexpAssocs).
      super__Vector_base<GdlSlotRefExpression_*,_std::allocator<GdlSlotRefExpression_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppGVar2) {
    uVar3 = 0;
    do {
      if (ppGVar2[uVar3] != (GdlSlotRefExpression *)0x0) {
        (**(code **)(*(long *)ppGVar2[uVar3] + 0x10))();
      }
      uVar3 = uVar3 + 1;
      ppGVar2 = (this->m_vpexpAssocs).
                super__Vector_base<GdlSlotRefExpression_*,_std::allocator<GdlSlotRefExpression_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar3 < (ulong)((long)(this->m_vpexpAssocs).
                                   super__Vector_base<GdlSlotRefExpression_*,_std::allocator<GdlSlotRefExpression_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppGVar2 >> 3))
    ;
  }
  if (this->m_pexpSelector != (GdlSlotRefExpression *)0x0) {
    (**(code **)(*(long *)this->m_pexpSelector + 0x10))();
  }
  piVar1 = (this->m_vnAssocs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1,(long)(this->m_vnAssocs).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)piVar1);
  }
  ppGVar2 = (this->m_vpexpAssocs).
            super__Vector_base<GdlSlotRefExpression_*,_std::allocator<GdlSlotRefExpression_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppGVar2 != (pointer)0x0) {
    operator_delete(ppGVar2,(long)(this->m_vpexpAssocs).
                                  super__Vector_base<GdlSlotRefExpression_*,_std::allocator<GdlSlotRefExpression_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppGVar2
                   );
  }
  GdlSetAttrItem::~GdlSetAttrItem(&this->super_GdlSetAttrItem);
  return;
}

Assistant:

virtual ~GdlSubstitutionItem()
	{
		for (size_t i = 0; i < m_vpexpAssocs.size(); ++i)
			delete m_vpexpAssocs[i];

		if (m_pexpSelector)
			delete m_pexpSelector;
	}